

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labels_solver.h
# Opt level: O2

uint UFPC::Merge(uint i,uint j)

{
  uint uVar1;
  uint *puVar2;
  ulong uVar3;
  ulong uVar4;
  uint root;
  uint uVar5;
  bool bVar6;
  
  puVar2 = P_;
  uVar3 = (ulong)i;
  do {
    uVar4 = uVar3;
    uVar3 = (ulong)P_[uVar4];
  } while (P_[uVar4] < (uint)uVar4);
  uVar1 = j;
  if (i != j) {
    do {
      uVar5 = uVar1;
      uVar1 = P_[uVar5];
    } while (P_[uVar5] < uVar5);
    if (uVar5 <= (uint)uVar4) {
      uVar4 = (ulong)uVar5;
    }
    do {
      uVar1 = puVar2[j];
      puVar2[j] = (uint)uVar4;
      bVar6 = uVar1 < j;
      j = uVar1;
    } while (bVar6);
  }
  do {
    uVar1 = puVar2[i];
    puVar2[i] = (uint)uVar4;
    bVar6 = uVar1 < i;
    i = uVar1;
  } while (bVar6);
  return (uint)uVar4;
}

Assistant:

static unsigned Merge(unsigned i, unsigned j)
    {
        // FindRoot(i)
        unsigned root(i);
        while (P_[root] < root) {
            root = P_[root];
        }
        if (i != j) {
            // FindRoot(j)
            unsigned root_j(j);
            while (P_[root_j] < root_j) {
                root_j = P_[root_j];
            }
            if (root > root_j) {
                root = root_j;
            }
            // SetRoot(j, root);
            while (P_[j] < j) {
                unsigned t = P_[j];
                P_[j] = root;
                j = t;
            }
            P_[j] = root;
        }
        // SetRoot(i, root);
        while (P_[i] < i) {
            unsigned t = P_[i];
            P_[i] = root;
            i = t;
        }
        P_[i] = root;
        return root;
    }